

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

value * __thiscall
mjs::interpreter::eval(value *__return_storage_ptr__,interpreter *this,statement *s)

{
  bool bVar1;
  pointer piVar2;
  object_ptr *error;
  wostream *os;
  native_error_exception *this_00;
  global_object *this_01;
  wstring local_258 [32];
  wstring_view local_238;
  undefined1 local_228 [16];
  wstring local_218;
  _Any_data local_1f8;
  wostringstream local_1e8 [8];
  wostringstream woss;
  undefined1 local_60 [8];
  completion c;
  statement *s_local;
  interpreter *this_local;
  
  c.target._M_str = (wchar_t *)s;
  piVar2 = std::unique_ptr<mjs::interpreter::impl,_std::default_delete<mjs::interpreter::impl>_>::
           operator->(&this->impl_);
  impl::hoist(piVar2,(statement *)c.target._M_str);
  piVar2 = std::unique_ptr<mjs::interpreter::impl,_std::default_delete<mjs::interpreter::impl>_>::
           operator->(&this->impl_);
  impl::eval((completion *)local_60,piVar2,(statement *)c.target._M_str);
  bVar1 = completion::operator_cast_to_bool((completion *)local_60);
  if (!bVar1) {
    value::value(__return_storage_ptr__,(value *)&c);
    completion::~completion((completion *)local_60);
    return __return_storage_ptr__;
  }
  if (local_60._0_4_ == throw_) {
    error = value::object_value((value *)&c);
    rethrow_error(error);
  }
  std::__cxx11::wostringstream::wostringstream(local_1e8);
  os = std::operator<<((wostream *)local_1e8,"Eval resulted in unexpected completion type ");
  mjs::operator<<(os,(completion *)local_60);
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  std::unique_ptr<mjs::interpreter::impl,_std::default_delete<mjs::interpreter::impl>_>::operator->
            (&this->impl_);
  impl::global((impl *)local_228);
  this_01 = gc_heap_ptr<mjs::global_object>::operator->
                      ((gc_heap_ptr<mjs::global_object> *)local_228);
  global_object::stack_trace_abi_cxx11_((wstring *)(local_228 + 0x10),this_01);
  local_1f8 = (_Any_data)
              std::__cxx11::wstring::operator_cast_to_basic_string_view
                        ((wstring *)(local_228 + 0x10));
  std::__cxx11::wostringstream::str();
  local_238 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_258);
  native_error_exception::native_error_exception(this_00,eval,(wstring_view *)&local_1f8,&local_238)
  ;
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

value interpreter::eval(const statement& s) {
    impl_->hoist(s);
    auto c = impl_->eval(s);
    if (!c) {
        return c.result;
    } else if (c.type == completion_type::throw_) {
        rethrow_error(c.result.object_value());
    }
    std::wostringstream woss;
    woss << "Eval resulted in unexpected completion type " << c;
    throw native_error_exception{native_error_type::eval, impl_->global()->stack_trace(), woss.str()};
}